

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FileDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this)

{
  size_t *this_00;
  key_type kVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Type TVar5;
  size_type sVar6;
  FileDescriptor *pFVar7;
  string *psVar8;
  ulong uVar9;
  FileOptions *options;
  EnumDescriptor *this_01;
  FieldDescriptor *pFVar10;
  size_type sVar11;
  Descriptor *pDVar12;
  ServiceDescriptor *this_02;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::Descriptor_*>,_bool> pVar13;
  SubstituteArg local_c58;
  SubstituteArg local_c28;
  SubstituteArg local_bf8;
  SubstituteArg local_bc8;
  SubstituteArg local_b98;
  SubstituteArg local_b68;
  SubstituteArg local_b38;
  SubstituteArg local_b08;
  SubstituteArg local_ad8;
  SubstituteArg local_aa8;
  int local_a74;
  Descriptor *pDStack_a70;
  int i_5;
  Descriptor *containing_type;
  undefined1 local_a60 [4];
  int i_4;
  SubstituteArg local_a30;
  SubstituteArg local_a00;
  SubstituteArg local_9d0;
  SubstituteArg local_9a0;
  SubstituteArg local_970;
  SubstituteArg local_940;
  SubstituteArg local_910;
  SubstituteArg local_8e0;
  SubstituteArg local_8b0;
  Descriptor *local_880;
  int local_874;
  _Rb_tree_const_iterator<const_google::protobuf::Descriptor_*> _Stack_870;
  int i_3;
  undefined1 local_868;
  Descriptor *local_860;
  int local_854;
  undefined1 local_850 [4];
  int i_2;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  undefined1 local_818 [4];
  int i_1;
  SubstituteArg local_7e8;
  SubstituteArg local_7b8;
  SubstituteArg local_788;
  SubstituteArg local_758;
  SubstituteArg local_728;
  SubstituteArg local_6f8;
  SubstituteArg local_6c8;
  SubstituteArg local_698;
  SubstituteArg local_668;
  SubstituteArg local_638;
  SubstituteArg local_608;
  SubstituteArg local_5d8;
  SubstituteArg local_5a8;
  SubstituteArg local_578;
  SubstituteArg local_548;
  SubstituteArg local_518;
  SubstituteArg local_4e8;
  SubstituteArg local_4b8;
  SubstituteArg local_488;
  SubstituteArg local_458;
  SubstituteArg local_428;
  SubstituteArg local_3f8;
  SubstituteArg local_3c8;
  SubstituteArg local_398;
  SubstituteArg local_368;
  SubstituteArg local_338;
  SubstituteArg local_308;
  SubstituteArg local_2d8;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  SubstituteArg local_f8;
  SubstituteArg local_c8;
  key_type local_94;
  undefined1 local_90 [4];
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  allocator<char> local_1a;
  byte local_19;
  FileDescriptor *local_18;
  FileDescriptor *this_local;
  string *contents;
  
  local_19 = 0;
  local_18 = this;
  this_local = (FileDescriptor *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"syntax = \"proto2\";\n\n",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  this_00 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_90);
  std::set<int,std::less<int>,std::allocator<int>>::insert<int*>
            ((set<int,std::less<int>,std::allocator<int>> *)this_00,*(int **)(this + 0x30),
             *(int **)(this + 0x30) + *(int *)(this + 0x28));
  std::set<int,std::less<int>,std::allocator<int>>::insert<int*>
            ((set<int,std::less<int>,std::allocator<int>> *)local_90,*(int **)(this + 0x40),
             *(int **)(this + 0x40) + *(int *)(this + 0x38));
  for (local_94 = 0; kVar1 = local_94, iVar3 = dependency_count(this), kVar1 < iVar3;
      local_94 = local_94 + 1) {
    sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_94
                      );
    if (sVar6 == 0) {
      sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_90,&local_94);
      if (sVar6 == 0) {
        pFVar7 = dependency(this,local_94);
        psVar8 = name_abi_cxx11_(pFVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_488,psVar8);
        strings::internal::SubstituteArg::SubstituteArg(&local_4b8);
        strings::internal::SubstituteArg::SubstituteArg(&local_4e8);
        strings::internal::SubstituteArg::SubstituteArg(&local_518);
        strings::internal::SubstituteArg::SubstituteArg(&local_548);
        strings::internal::SubstituteArg::SubstituteArg(&local_578);
        strings::internal::SubstituteArg::SubstituteArg(&local_5a8);
        strings::internal::SubstituteArg::SubstituteArg(&local_5d8);
        strings::internal::SubstituteArg::SubstituteArg(&local_608);
        strings::internal::SubstituteArg::SubstituteArg(&local_638);
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import \"$0\";\n",&local_488,&local_4b8,&local_4e8,
                   &local_518,&local_548,&local_578,&local_5a8,&local_5d8,&local_608,&local_638);
      }
      else {
        pFVar7 = dependency(this,local_94);
        psVar8 = name_abi_cxx11_(pFVar7);
        strings::internal::SubstituteArg::SubstituteArg(&local_2a8,psVar8);
        strings::internal::SubstituteArg::SubstituteArg(&local_2d8);
        strings::internal::SubstituteArg::SubstituteArg(&local_308);
        strings::internal::SubstituteArg::SubstituteArg(&local_338);
        strings::internal::SubstituteArg::SubstituteArg(&local_368);
        strings::internal::SubstituteArg::SubstituteArg(&local_398);
        strings::internal::SubstituteArg::SubstituteArg(&local_3c8);
        strings::internal::SubstituteArg::SubstituteArg(&local_3f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_428);
        strings::internal::SubstituteArg::SubstituteArg(&local_458);
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import weak \"$0\";\n",&local_2a8,&local_2d8,&local_308,
                   &local_338,&local_368,&local_398,&local_3c8,&local_3f8,&local_428,&local_458);
      }
    }
    else {
      pFVar7 = dependency(this,local_94);
      psVar8 = name_abi_cxx11_(pFVar7);
      strings::internal::SubstituteArg::SubstituteArg(&local_c8,psVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_128);
      strings::internal::SubstituteArg::SubstituteArg(&local_158);
      strings::internal::SubstituteArg::SubstituteArg(&local_188);
      strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_218);
      strings::internal::SubstituteArg::SubstituteArg(&local_248);
      strings::internal::SubstituteArg::SubstituteArg(&local_278);
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"import public \"$0\";\n",&local_c8,&local_f8,&local_128,
                 &local_158,&local_188,&local_1b8,&local_1e8,&local_218,&local_248,&local_278);
    }
  }
  package_abi_cxx11_(this);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    psVar8 = package_abi_cxx11_(this);
    strings::internal::SubstituteArg::SubstituteArg(&local_668,psVar8);
    strings::internal::SubstituteArg::SubstituteArg(&local_698);
    strings::internal::SubstituteArg::SubstituteArg(&local_6c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_6f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_728);
    strings::internal::SubstituteArg::SubstituteArg(&local_758);
    strings::internal::SubstituteArg::SubstituteArg(&local_788);
    strings::internal::SubstituteArg::SubstituteArg(&local_7b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_7e8);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_818);
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",&local_668,&local_698,&local_6c8,&local_6f8,
               &local_728,&local_758,&local_788,&local_7b8,&local_7e8,(SubstituteArg *)local_818);
  }
  options = FileDescriptor::options(this);
  bVar2 = anon_unknown_1::FormatLineOptions(0,&options->super_Message,__return_storage_ptr__);
  if (bVar2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  for (groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      iVar3 = groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
      iVar4 = enum_type_count(this), iVar3 < iVar4;
      groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    this_01 = enum_type(this,groups._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    EnumDescriptor::DebugString(this_01,0,__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
         *)local_850);
  for (local_854 = 0; iVar3 = local_854, iVar4 = extension_count(this), iVar3 < iVar4;
      local_854 = local_854 + 1) {
    pFVar10 = extension(this,local_854);
    TVar5 = FieldDescriptor::type(pFVar10);
    if (TVar5 == TYPE_GROUP) {
      pFVar10 = extension(this,local_854);
      local_860 = FieldDescriptor::message_type(pFVar10);
      pVar13 = std::
               set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         *)local_850,&local_860);
      _Stack_870 = pVar13.first._M_node;
      local_868 = pVar13.second;
    }
  }
  for (local_874 = 0; iVar3 = local_874, iVar4 = message_type_count(this), iVar3 < iVar4;
      local_874 = local_874 + 1) {
    local_880 = message_type(this,local_874);
    sVar11 = std::
             set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ::count((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)local_850,&local_880);
    if (sVar11 == 0) {
      pDVar12 = message_type(this,local_874);
      psVar8 = Descriptor::name_abi_cxx11_(pDVar12);
      strings::internal::SubstituteArg::SubstituteArg(&local_8b0,psVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_8e0);
      strings::internal::SubstituteArg::SubstituteArg(&local_910);
      strings::internal::SubstituteArg::SubstituteArg(&local_940);
      strings::internal::SubstituteArg::SubstituteArg(&local_970);
      strings::internal::SubstituteArg::SubstituteArg(&local_9a0);
      strings::internal::SubstituteArg::SubstituteArg(&local_9d0);
      strings::internal::SubstituteArg::SubstituteArg(&local_a00);
      strings::internal::SubstituteArg::SubstituteArg(&local_a30);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_a60);
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"message $0",&local_8b0,&local_8e0,&local_910,&local_940,
                 &local_970,&local_9a0,&local_9d0,&local_a00,&local_a30,(SubstituteArg *)local_a60);
      pDVar12 = message_type(this,local_874);
      Descriptor::DebugString(pDVar12,0,__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  for (containing_type._4_4_ = 0; iVar3 = containing_type._4_4_, iVar4 = service_count(this),
      iVar3 < iVar4; containing_type._4_4_ = containing_type._4_4_ + 1) {
    this_02 = service(this,containing_type._4_4_);
    ServiceDescriptor::DebugString(this_02,__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  pDStack_a70 = (Descriptor *)0x0;
  for (local_a74 = 0; iVar3 = local_a74, iVar4 = extension_count(this), iVar3 < iVar4;
      local_a74 = local_a74 + 1) {
    pFVar10 = extension(this,local_a74);
    pDVar12 = FieldDescriptor::containing_type(pFVar10);
    if (pDVar12 != pDStack_a70) {
      if (0 < local_a74) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pFVar10 = extension(this,local_a74);
      pDStack_a70 = FieldDescriptor::containing_type(pFVar10);
      psVar8 = Descriptor::full_name_abi_cxx11_(pDStack_a70);
      strings::internal::SubstituteArg::SubstituteArg(&local_aa8,psVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_ad8);
      strings::internal::SubstituteArg::SubstituteArg(&local_b08);
      strings::internal::SubstituteArg::SubstituteArg(&local_b38);
      strings::internal::SubstituteArg::SubstituteArg(&local_b68);
      strings::internal::SubstituteArg::SubstituteArg(&local_b98);
      strings::internal::SubstituteArg::SubstituteArg(&local_bc8);
      strings::internal::SubstituteArg::SubstituteArg(&local_bf8);
      strings::internal::SubstituteArg::SubstituteArg(&local_c28);
      strings::internal::SubstituteArg::SubstituteArg(&local_c58);
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"extend .$0 {\n",&local_aa8,&local_ad8,&local_b08,&local_b38
                 ,&local_b68,&local_b98,&local_bc8,&local_bf8,&local_c28,&local_c58);
    }
    pFVar10 = extension(this,local_a74);
    FieldDescriptor::DebugString(pFVar10,1,__return_storage_ptr__);
  }
  iVar3 = extension_count(this);
  if (0 < iVar3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  local_19 = 1;
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)local_850);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_90);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileDescriptor::DebugString() const {
  string contents = "syntax = \"proto2\";\n\n";

  set<int> public_dependencies;
  set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                   dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                   dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                   dependency(i)->name());
    }
  }

  if (!package().empty()) {
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
  }

  if (FormatLineOptions(0, options(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      strings::SubstituteAndAppend(&contents, "message $0",
                                   message_type(i)->name());
      message_type(i)->DebugString(0, &contents);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents);
    contents.append("\n");
  }

  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                   containing_type->full_name());
    }
    extension(i)->DebugString(1, &contents);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  return contents;
}